

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_impl_ssse3.c
# Opt level: O0

void aom_var_filter_block2d_bil_second_pass_ssse3
               (uint16_t *a,uint8_t *b,uint src_pixels_per_line,uint pixel_step,uint output_height,
               uint output_width,uint8_t *filter)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint in_ECX;
  int in_EDX;
  void *in_RSI;
  longlong lVar7;
  void *in_RDI;
  uint in_R8D;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar8 [16];
  __m128i alVar9;
  byte *in_stack_00000008;
  __m128i res;
  __m128i source_shuffle;
  __m128i source;
  __m128i source2;
  __m128i source1;
  uint j;
  uint i;
  __m128i mask;
  __m128i shuffle_mask;
  __m128i filters;
  __m128i r;
  int16_t round;
  undefined8 local_288;
  undefined8 uStack_280;
  uint local_230;
  uint local_22c;
  void *local_1c8;
  void *local_1c0;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  
  bVar1 = *in_stack_00000008;
  bVar2 = in_stack_00000008[1];
  auVar6[1] = 0;
  auVar6[0] = bVar1;
  auVar6[9] = 0;
  auVar6[8] = bVar1;
  auVar6[2] = bVar2;
  auVar6[3] = 0;
  auVar6[4] = bVar1;
  auVar6[5] = 0;
  auVar6[6] = bVar2;
  auVar6[7] = 0;
  auVar6[10] = bVar2;
  auVar6[0xb] = 0;
  auVar6[0xc] = bVar1;
  auVar6[0xd] = 0;
  auVar6[0xe] = bVar2;
  lVar7 = CONCAT71((uint7)((ulong)in_RSI >> 8) & 0xffffffffffff00,0xc);
  local_1c8 = in_RSI;
  local_1c0 = in_RDI;
  for (local_22c = 0; local_22c < in_R8D; local_22c = local_22c + 1) {
    for (local_230 = 0; local_230 < in_R9D; local_230 = local_230 + 4) {
      xx_loadl_64(local_1c0);
      alVar9 = xx_loadl_64((void *)((long)local_1c0 + (ulong)in_ECX * 2));
      auVar5._8_8_ = extraout_XMM0_Qa_00;
      auVar5._0_8_ = extraout_XMM0_Qa;
      auVar4._8_8_ = 0xf0e07060d0c0504;
      auVar4._0_8_ = 0xb0a030209080100;
      auVar8 = pshufb(auVar5,auVar4);
      auVar6[0xf] = 0;
      auVar8 = pmaddwd(auVar8,auVar6);
      local_c8 = auVar8._0_4_;
      iStack_c4 = auVar8._4_4_;
      iStack_c0 = auVar8._8_4_;
      iStack_bc = auVar8._12_4_;
      auVar8 = ZEXT416(7);
      local_288 = CONCAT44(iStack_c4 + 0x40 >> auVar8,local_c8 + 0x40 >> auVar8);
      uStack_280._0_4_ = iStack_c0 + 0x40 >> auVar8;
      uStack_280._4_4_ = iStack_bc + 0x40 >> auVar8;
      auVar3._8_8_ = uStack_280;
      auVar3._0_8_ = local_288;
      auVar8._8_8_ = 0x101010101010101;
      auVar8._0_8_ = 0x10101010c080400;
      pshufb(auVar3,auVar8);
      alVar9[0] = lVar7;
      xx_storel_32(local_1c8,alVar9);
      local_1c0 = (void *)((long)local_1c0 + 8);
      local_1c8 = (void *)((long)local_1c8 + 4);
    }
    local_1c0 = (void *)((long)local_1c0 + (ulong)(in_EDX - in_R9D) * 2);
  }
  return;
}

Assistant:

void aom_var_filter_block2d_bil_second_pass_ssse3(
    const uint16_t *a, uint8_t *b, unsigned int src_pixels_per_line,
    unsigned int pixel_step, unsigned int output_height,
    unsigned int output_width, const uint8_t *filter) {
  const int16_t round = (1 << FILTER_BITS) >> 1;
  const __m128i r = _mm_set1_epi32(round);
  const __m128i filters =
      _mm_setr_epi16(filter[0], filter[1], filter[0], filter[1], filter[0],
                     filter[1], filter[0], filter[1]);
  const __m128i shuffle_mask =
      _mm_setr_epi8(0, 1, 8, 9, 2, 3, 10, 11, 4, 5, 12, 13, 6, 7, 14, 15);
  const __m128i mask =
      _mm_setr_epi8(0, 4, 8, 12, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1);
  unsigned int i, j;

  for (i = 0; i < output_height; ++i) {
    for (j = 0; j < output_width; j += 4) {
      // load source as:
      // { a[0], a[1], a[2], a[3], a[w], a[w+1], a[w+2], a[w+3] }
      __m128i source1 = xx_loadl_64(a);
      __m128i source2 = xx_loadl_64(a + pixel_step);
      __m128i source = _mm_unpacklo_epi64(source1, source2);

      // shuffle source to:
      // { a[0], a[w], a[1], a[w+1], a[2], a[w+2], a[3], a[w+3] }
      __m128i source_shuffle = _mm_shuffle_epi8(source, shuffle_mask);

      // b[i] = a[i] * filter[0] + a[w + i] * filter[1]
      __m128i res = _mm_madd_epi16(source_shuffle, filters);

      // round
      res = _mm_srai_epi32(_mm_add_epi32(res, r), FILTER_BITS);

      // shuffle to get each lower 8 bit of every 32 bit
      res = _mm_shuffle_epi8(res, mask);

      xx_storel_32(b, res);

      a += 4;
      b += 4;
    }

    a += src_pixels_per_line - output_width;
  }
}